

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_32x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar11 [16];
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  __m128i round;
  __m128i scaled_top_right4;
  __m128i scaled_top_right3;
  __m128i scaled_top_right2;
  __m128i scaled_top_right1;
  __m128i inverted_weights4;
  __m128i inverted_weights3;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights4;
  __m128i weights3;
  __m128i weights2;
  __m128i weights1;
  __m128i scale;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i left1;
  __m128i top_right;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_e5c;
  int local_e1c;
  undefined8 *local_cd8;
  byte local_c58;
  undefined1 uStack_c57;
  undefined1 uStack_c56;
  undefined1 uStack_c55;
  byte bStack_c54;
  undefined1 uStack_c53;
  undefined1 uStack_c52;
  undefined1 uStack_c51;
  byte local_b18;
  undefined1 uStack_b17;
  undefined1 uStack_b16;
  undefined1 uStack_b15;
  byte bStack_b14;
  undefined1 uStack_b13;
  undefined1 uStack_b12;
  undefined1 uStack_b11;
  ushort uStack_a82;
  ushort uStack_a7a;
  ushort uStack_a62;
  ushort uStack_a5a;
  ushort uStack_a42;
  ushort uStack_a3a;
  ushort uStack_a26;
  ushort uStack_a24;
  ushort uStack_a22;
  ushort uStack_a1e;
  ushort uStack_a1c;
  ushort uStack_a1a;
  short local_638;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short sStack_630;
  short sStack_62e;
  short sStack_62c;
  short sStack_62a;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  __m128i left_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left2;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  
  bVar2 = *(byte *)(in_RDX + 0x1f);
  uVar6 = (ushort)bVar2;
  uVar1 = *in_RCX;
  local_b18 = (byte)uVar1;
  uStack_b17 = (undefined1)((ulong)uVar1 >> 8);
  uStack_b16 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_b15 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_b14 = (byte)((ulong)uVar1 >> 0x20);
  uStack_b13 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_b12 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_b11 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_a26 = (ushort)bVar2;
  uStack_a24 = (ushort)bVar2;
  uStack_a22 = (ushort)bVar2;
  uStack_a1e = (ushort)bVar2;
  uStack_a1c = (ushort)bVar2;
  uStack_a1a = (ushort)bVar2;
  uStack_a42 = (ushort)bVar2;
  uStack_a3a = (ushort)bVar2;
  uStack_a62 = (ushort)bVar2;
  uStack_a5a = (ushort)bVar2;
  uStack_a82 = (ushort)bVar2;
  uStack_a7a = (ushort)bVar2;
  local_cd8 = in_RDI;
  for (local_e1c = 0x1000100; local_e1c < 0xf0e0f0f; local_e1c = local_e1c + 0x2020202) {
    auVar4._4_4_ = local_e1c;
    auVar4._0_4_ = local_e1c;
    auVar4._12_4_ = local_e1c;
    auVar4._8_4_ = local_e1c;
    auVar5[1] = 0;
    auVar5[0] = local_b18;
    auVar5[2] = uStack_b17;
    auVar5[3] = 0;
    auVar5[4] = uStack_b16;
    auVar5[5] = 0;
    auVar5[6] = uStack_b15;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_b14;
    auVar5[10] = uStack_b13;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_b12;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_b11;
    auVar5[0xf] = 0;
    auVar11 = pshufb(auVar5,auVar4);
    local_2b8 = auVar11._0_2_;
    sStack_2b6 = auVar11._2_2_;
    sStack_2b4 = auVar11._4_2_;
    sStack_2b2 = auVar11._6_2_;
    sStack_2b0 = auVar11._8_2_;
    sStack_2ae = auVar11._10_2_;
    sStack_2ac = auVar11._12_2_;
    sStack_2aa = auVar11._14_2_;
    uVar7 = uVar6 + local_2b8 * 0xff + 0x80;
    uVar12 = uStack_a26 * 0x10 + sStack_2b6 * 0xf0 + 0x80;
    uVar16 = uStack_a24 * 0x1f + sStack_2b4 * 0xe1 + 0x80;
    uVar20 = uStack_a22 * 0x2e + sStack_2b2 * 0xd2 + 0x80;
    uVar24 = uVar6 * 0x3c + sStack_2b0 * 0xc4 + 0x80;
    uVar28 = uStack_a1e * 0x4a + sStack_2ae * 0xb6 + 0x80;
    uVar32 = uStack_a1c * 0x57 + sStack_2ac * 0xa9 + 0x80;
    uVar36 = uStack_a1a * 99 + sStack_2aa * 0x9d + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0x6f + local_2b8 * 0x91 + 0x80;
    uVar14 = uStack_a26 * 0x7b + sStack_2b6 * 0x85 + 0x80;
    uVar18 = uStack_a24 * 0x86 + sStack_2b4 * 0x7a + 0x80;
    uVar22 = uStack_a42 * 0x91 + sStack_2b2 * 0x6f + 0x80;
    uVar26 = uVar6 * 0x9b + sStack_2b0 * 0x65 + 0x80;
    uVar30 = uStack_a1e * 0xa4 + sStack_2ae * 0x5c + 0x80;
    uVar34 = uStack_a1c * 0xad + sStack_2ac * 0x53 + 0x80;
    uVar38 = uStack_a3a * 0xb6 + sStack_2aa * 0x4a + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_cd8 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                            (0xff < uVar29),
                                            CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                     (char)(uVar24 >> 8) - (0xff < uVar25),
                                                     CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                              (char)(uVar20 >> 8) - (0xff < uVar21),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar13 != 0) *
                                                                                (uVar13 < 0x100) *
                                                                                (char)(uVar12 >> 8)
                                                                                - (0xff < uVar13),
                                                                                (uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8)))))))
                         );
    local_cd8[1] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar10 != 0) * (uVar10 < 0x100) *
                                                  (char)(uVar9 >> 8) - (0xff < uVar10))))))));
    uVar7 = uVar6 * 0xbe + local_2b8 * 0x42 + 0x80;
    uVar12 = uStack_a26 * 0xc5 + sStack_2b6 * 0x3b + 0x80;
    uVar16 = uStack_a24 * 0xcc + sStack_2b4 * 0x34 + 0x80;
    uVar20 = uStack_a62 * 0xd3 + sStack_2b2 * 0x2d + 0x80;
    uVar24 = uVar6 * 0xd9 + sStack_2b0 * 0x27 + 0x80;
    uVar28 = uStack_a1e * 0xde + sStack_2ae * 0x22 + 0x80;
    uVar32 = uStack_a1c * 0xe3 + sStack_2ac * 0x1d + 0x80;
    uVar36 = uStack_a5a * 0xe7 + sStack_2aa * 0x19 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xeb + local_2b8 * 0x15 + 0x80;
    uVar14 = uStack_a26 * 0xef + sStack_2b6 * 0x11 + 0x80;
    uVar18 = uStack_a24 * 0xf2 + sStack_2b4 * 0xe + 0x80;
    uVar22 = uStack_a82 * 0xf4 + sStack_2b2 * 0xc + 0x80;
    uVar26 = uVar6 * 0xf6 + sStack_2b0 * 10 + 0x80;
    uVar30 = uStack_a1e * 0xf7 + sStack_2ae * 9 + 0x80;
    uVar34 = uStack_a1c * 0xf8 + sStack_2ac * 8 + 0x80;
    uVar38 = uStack_a7a * 0xf8 + sStack_2aa * 8 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_cd8[2] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37)
                            ,CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                      (0xff < uVar33),
                                      CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                               (char)(uVar28 >> 8) - (0xff < uVar29),
                                               CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                        (char)(uVar24 >> 8) - (0xff < uVar25),
                                                        CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                 (char)(uVar20 >> 8) -
                                                                 (0xff < uVar21),
                                                                 CONCAT12((uVar17 != 0) *
                                                                          (uVar17 < 0x100) *
                                                                          (char)(uVar16 >> 8) -
                                                                          (0xff < uVar17),
                                                                          CONCAT11((uVar13 != 0) *
                                                                                   (uVar13 < 0x100)
                                                                                   * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
    local_cd8[3] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar10 != 0) * (uVar10 < 0x100) *
                                                  (char)(uVar9 >> 8) - (0xff < uVar10))))))));
    local_cd8 = (undefined8 *)(in_RSI + (long)local_cd8);
  }
  uVar1 = in_RCX[1];
  local_c58 = (byte)uVar1;
  uStack_c57 = (undefined1)((ulong)uVar1 >> 8);
  uStack_c56 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_c55 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_c54 = (byte)((ulong)uVar1 >> 0x20);
  uStack_c53 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_c52 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_c51 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_e5c = 0x1000100; local_e5c < 0xf0e0f0f; local_e5c = local_e5c + 0x2020202) {
    auVar11._4_4_ = local_e5c;
    auVar11._0_4_ = local_e5c;
    auVar11._12_4_ = local_e5c;
    auVar11._8_4_ = local_e5c;
    auVar3[1] = 0;
    auVar3[0] = local_c58;
    auVar3[2] = uStack_c57;
    auVar3[3] = 0;
    auVar3[4] = uStack_c56;
    auVar3[5] = 0;
    auVar3[6] = uStack_c55;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_c54;
    auVar3[10] = uStack_c53;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_c52;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_c51;
    auVar3[0xf] = 0;
    auVar11 = pshufb(auVar3,auVar11);
    local_638 = auVar11._0_2_;
    sStack_636 = auVar11._2_2_;
    sStack_634 = auVar11._4_2_;
    sStack_632 = auVar11._6_2_;
    sStack_630 = auVar11._8_2_;
    sStack_62e = auVar11._10_2_;
    sStack_62c = auVar11._12_2_;
    sStack_62a = auVar11._14_2_;
    uVar7 = uVar6 + local_638 * 0xff + 0x80;
    uVar12 = uStack_a26 * 0x10 + sStack_636 * 0xf0 + 0x80;
    uVar16 = uStack_a24 * 0x1f + sStack_634 * 0xe1 + 0x80;
    uVar20 = uStack_a22 * 0x2e + sStack_632 * 0xd2 + 0x80;
    uVar24 = uVar6 * 0x3c + sStack_630 * 0xc4 + 0x80;
    uVar28 = uStack_a1e * 0x4a + sStack_62e * 0xb6 + 0x80;
    uVar32 = uStack_a1c * 0x57 + sStack_62c * 0xa9 + 0x80;
    uVar36 = uStack_a1a * 99 + sStack_62a * 0x9d + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0x6f + local_638 * 0x91 + 0x80;
    uVar14 = uStack_a26 * 0x7b + sStack_636 * 0x85 + 0x80;
    uVar18 = uStack_a24 * 0x86 + sStack_634 * 0x7a + 0x80;
    uVar22 = uStack_a42 * 0x91 + sStack_632 * 0x6f + 0x80;
    uVar26 = uVar6 * 0x9b + sStack_630 * 0x65 + 0x80;
    uVar30 = uStack_a1e * 0xa4 + sStack_62e * 0x5c + 0x80;
    uVar34 = uStack_a1c * 0xad + sStack_62c * 0x53 + 0x80;
    uVar38 = uStack_a3a * 0xb6 + sStack_62a * 0x4a + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_cd8 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                            (0xff < uVar29),
                                            CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                     (char)(uVar24 >> 8) - (0xff < uVar25),
                                                     CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                              (char)(uVar20 >> 8) - (0xff < uVar21),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar13 != 0) *
                                                                                (uVar13 < 0x100) *
                                                                                (char)(uVar12 >> 8)
                                                                                - (0xff < uVar13),
                                                                                (uVar8 != 0) *
                                                                                (uVar8 < 0x100) *
                                                                                (char)(uVar7 >> 8) -
                                                                                (0xff < uVar8)))))))
                         );
    local_cd8[1] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar10 != 0) * (uVar10 < 0x100) *
                                                  (char)(uVar9 >> 8) - (0xff < uVar10))))))));
    uVar7 = uVar6 * 0xbe + local_638 * 0x42 + 0x80;
    uVar12 = uStack_a26 * 0xc5 + sStack_636 * 0x3b + 0x80;
    uVar16 = uStack_a24 * 0xcc + sStack_634 * 0x34 + 0x80;
    uVar20 = uStack_a62 * 0xd3 + sStack_632 * 0x2d + 0x80;
    uVar24 = uVar6 * 0xd9 + sStack_630 * 0x27 + 0x80;
    uVar28 = uStack_a1e * 0xde + sStack_62e * 0x22 + 0x80;
    uVar32 = uStack_a1c * 0xe3 + sStack_62c * 0x1d + 0x80;
    uVar36 = uStack_a5a * 0xe7 + sStack_62a * 0x19 + 0x80;
    uVar8 = uVar7 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar9 = uVar6 * 0xeb + local_638 * 0x15 + 0x80;
    uVar14 = uStack_a26 * 0xef + sStack_636 * 0x11 + 0x80;
    uVar18 = uStack_a24 * 0xf2 + sStack_634 * 0xe + 0x80;
    uVar22 = uStack_a82 * 0xf4 + sStack_632 * 0xc + 0x80;
    uVar26 = uVar6 * 0xf6 + sStack_630 * 10 + 0x80;
    uVar30 = uStack_a1e * 0xf7 + sStack_62e * 9 + 0x80;
    uVar34 = uStack_a1c * 0xf8 + sStack_62c * 8 + 0x80;
    uVar38 = uStack_a7a * 0xf8 + sStack_62a * 8 + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    local_cd8[2] = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37)
                            ,CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                      (0xff < uVar33),
                                      CONCAT15((uVar29 != 0) * (uVar29 < 0x100) *
                                               (char)(uVar28 >> 8) - (0xff < uVar29),
                                               CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                        (char)(uVar24 >> 8) - (0xff < uVar25),
                                                        CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                                 (char)(uVar20 >> 8) -
                                                                 (0xff < uVar21),
                                                                 CONCAT12((uVar17 != 0) *
                                                                          (uVar17 < 0x100) *
                                                                          (char)(uVar16 >> 8) -
                                                                          (0xff < uVar17),
                                                                          CONCAT11((uVar13 != 0) *
                                                                                   (uVar13 < 0x100)
                                                                                   * (char)(uVar12 
                                                  >> 8) - (0xff < uVar13),
                                                  (uVar8 != 0) * (uVar8 < 0x100) *
                                                  (char)(uVar7 >> 8) - (0xff < uVar8))))))));
    local_cd8[3] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar10 != 0) * (uVar10 < 0x100) *
                                                  (char)(uVar9 >> 8) - (0xff < uVar10))))))));
    local_cd8 = (undefined8 *)(in_RSI + (long)local_cd8);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_32x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
  const __m128i left2 =
      cvtepu8_epi16(LoadLo8((const uint8_t *)left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    dst += stride;
  }
}